

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

void strappend_base64(xar *xar,archive_string *as,char *s,size_t l)

{
  char **ppcVar1;
  byte *pbVar2;
  size_t sVar3;
  size_t n;
  int iVar4;
  uchar *out;
  int iVar5;
  archive_string *paVar6;
  uchar buff [256];
  byte local_138 [264];
  
  if (s != (char *)0x0) {
    pbVar2 = local_138;
    sVar3 = 0;
    do {
      n = sVar3;
      if ((base64[*(byte *)&as->s] < 0) || (base64[*(byte *)((long)&as->s + 1)] < 0)) break;
      paVar6 = (archive_string *)((long)&as->s + 2);
      iVar4 = base64[*(byte *)((long)&as->s + 1)] << 0xc;
      *pbVar2 = (byte)((uint)(base64[*(byte *)&as->s] << 0x12) >> 0x10) |
                (byte)((uint)iVar4 >> 0x10);
      n = sVar3 + 1;
      if (s == (char *)0x2) {
        pbVar2 = pbVar2 + 1;
        s = (char *)0x0;
      }
      else {
        ppcVar1 = &paVar6->s;
        if (base64[*(byte *)ppcVar1] < 0) break;
        paVar6 = (archive_string *)((long)&as->s + 3);
        iVar5 = base64[*(byte *)ppcVar1] << 6;
        pbVar2[1] = (byte)((uint)iVar4 >> 8) | (byte)((uint)iVar5 >> 8);
        n = sVar3 + 2;
        if (s == (char *)0x3) {
          pbVar2 = pbVar2 + 2;
          s = (char *)0x0;
        }
        else {
          ppcVar1 = &paVar6->s;
          if (base64[*(byte *)ppcVar1] < 0) break;
          paVar6 = (archive_string *)((long)&as->s + 4);
          pbVar2[2] = (byte)base64[*(byte *)ppcVar1] | (byte)iVar5;
          pbVar2 = pbVar2 + 3;
          n = sVar3 + 3;
          s = s + -4;
        }
      }
      sVar3 = n;
      if (n - 0xfd < 0xffffffffffffff00) {
        archive_strncat((archive_string *)xar,local_138,n);
        sVar3 = 0;
        pbVar2 = local_138;
      }
      n = sVar3;
      as = paVar6;
    } while (s != (char *)0x0);
    if (n != 0) {
      archive_strncat((archive_string *)xar,local_138,n);
    }
  }
  return;
}

Assistant:

static void
strappend_base64(struct xar *xar,
    struct archive_string *as, const char *s, size_t l)
{
	unsigned char buff[256];
	unsigned char *out;
	const unsigned char *b;
	size_t len;

	(void)xar; /* UNUSED */
	len = 0;
	out = buff;
	b = (const unsigned char *)s;
	while (l > 0) {
		int n = 0;

		if (base64[b[0]] < 0 || base64[b[1]] < 0)
			break;
		n = base64[*b++] << 18;
		n |= base64[*b++] << 12;
		*out++ = n >> 16;
		len++;
		l -= 2;

		if (l > 0) {
			if (base64[*b] < 0)
				break;
			n |= base64[*b++] << 6;
			*out++ = (n >> 8) & 0xFF;
			len++;
			--l;
		}
		if (l > 0) {
			if (base64[*b] < 0)
				break;
			n |= base64[*b++];
			*out++ = n & 0xFF;
			len++;
			--l;
		}
		if (len+3 >= sizeof(buff)) {
			archive_strncat(as, (const char *)buff, len);
			len = 0;
			out = buff;
		}
	}
	if (len > 0)
		archive_strncat(as, (const char *)buff, len);
}